

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceBuffer * __thiscall
slang::SourceManager::readHeader
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view path,
          SourceLocation includedFrom,bool isSystemPath)

{
  path *__lhs;
  pointer ppVar1;
  char cVar2;
  FileInfo *pFVar3;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *__range2;
  pointer ppVar4;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> userDirs;
  shared_lock<std::shared_mutex> readLock;
  path p;
  
  readLock._8_8_ = path._M_str;
  readLock._M_pm = (mutex_type *)path._M_len;
  if (readLock._M_pm == (mutex_type *)0x0) {
    assert::assertFailed
              ("!path.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
               ,0x150,
               "SourceBuffer slang::SourceManager::readHeader(string_view, SourceLocation, bool)");
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&p,(basic_string_view<char,_std::char_traits<char>_> *)&readLock,auto_format);
  cVar2 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar2 != '\0') {
    openCached(__return_storage_ptr__,this,&p,includedFrom);
    goto LAB_0019107a;
  }
  if (isSystemPath) {
    userDirs.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    userDirs.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    userDirs.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    readLock._M_owns = true;
    readLock._M_pm = &this->mut;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    operator=(&userDirs,&this->systemDirectories);
    std::shared_lock<std::shared_mutex>::~shared_lock(&readLock);
    ppVar1 = userDirs.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = userDirs.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppVar4 == ppVar1) goto LAB_00191067;
      std::filesystem::__cxx11::operator/((path *)&readLock,ppVar4,&p);
      openCached(__return_storage_ptr__,this,(path *)&readLock,includedFrom);
      std::filesystem::__cxx11::path::~path((path *)&readLock);
      ppVar4 = ppVar4 + 1;
    } while ((__return_storage_ptr__->id).id == 0);
  }
  else {
    pFVar3 = getFileInfo(this,(BufferID)(includedFrom._0_4_ & 0xfffffff));
    if (((pFVar3 != (FileInfo *)0x0) && (pFVar3->data != (FileData *)0x0)) &&
       (__lhs = pFVar3->data->directory, __lhs != (path *)0x0)) {
      std::filesystem::__cxx11::operator/((path *)&readLock,__lhs,&p);
      openCached(__return_storage_ptr__,this,(path *)&readLock,includedFrom);
      std::filesystem::__cxx11::path::~path((path *)&readLock);
      if ((__return_storage_ptr__->id).id != 0) goto LAB_0019107a;
    }
    userDirs.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    userDirs.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    userDirs.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    readLock._M_owns = true;
    readLock._M_pm = &this->mut;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    operator=(&userDirs,&this->userDirectories);
    std::shared_lock<std::shared_mutex>::~shared_lock(&readLock);
    ppVar1 = userDirs.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = userDirs.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppVar4 == ppVar1) goto LAB_00191067;
      std::filesystem::__cxx11::operator/((path *)&readLock,ppVar4,&p);
      openCached(__return_storage_ptr__,this,(path *)&readLock,includedFrom);
      std::filesystem::__cxx11::path::~path((path *)&readLock);
      ppVar4 = ppVar4 + 1;
    } while ((__return_storage_ptr__->id).id == 0);
  }
LAB_00191072:
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&userDirs);
LAB_0019107a:
  std::filesystem::__cxx11::path::~path(&p);
  return __return_storage_ptr__;
LAB_00191067:
  (__return_storage_ptr__->data)._M_len = 0;
  (__return_storage_ptr__->data)._M_str = (char *)0x0;
  *(undefined8 *)&__return_storage_ptr__->id = 0;
  goto LAB_00191072;
}

Assistant:

SourceRange SourceManager::getExpansionRange(SourceLocation location) const {
    auto buffer = location.buffer();
    if (!buffer)
        return SourceRange();

    std::shared_lock lock(mut);

    ASSERT(buffer.getId() < bufferEntries.size());
    const ExpansionInfo& info = std::get<ExpansionInfo>(bufferEntries[buffer.getId()]);
    return info.expansionRange;
}